

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  FieldDescriptor *this_00;
  uint uVar1;
  DynamicMessage *pDVar2;
  Descriptor *pDVar3;
  long lVar4;
  Type TVar5;
  LogMessage *other;
  uint *puVar6;
  Descriptor *type;
  Message *pMVar7;
  long lVar8;
  long i;
  LogFinisher local_79;
  DynamicMessage *local_78;
  DynamicMessageFactory *local_70;
  LogMessage local_68;
  
  pDVar2 = this->type_info_->prototype;
  local_78 = this;
  if (pDVar2 != (DynamicMessage *)0x0 && pDVar2 != this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/dynamic_message.cc"
               ,0x213);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: is_prototype(): ");
    internal::LogFinisher::operator=(&local_79,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pDVar3 = local_78->type_info_->type;
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    local_70 = local_78->type_info_->factory;
    lVar8 = 0;
    i = 0;
    do {
      lVar4 = *(long *)(pDVar3 + 0x30);
      this_00 = (FieldDescriptor *)(lVar4 + lVar8);
      puVar6 = internal::scoped_array<unsigned_int>::operator[](&local_78->type_info_->offsets,i);
      uVar1 = *puVar6;
      TVar5 = FieldDescriptor::type(this_00);
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 10) &&
         (*(int *)(lVar4 + 0x4c + lVar8) != 3)) {
        type = FieldDescriptor::message_type(this_00);
        pMVar7 = DynamicMessageFactory::GetPrototypeNoLock(local_70,type);
        *(Message **)
         ((long)&(local_78->super_Message).super_MessageLite._vptr_MessageLite + (long)(int)uVar1) =
             pMVar7;
      }
      i = i + 1;
      lVar8 = lVar8 + 0xa8;
    } while (i < *(int *)(pDVar3 + 0x2c));
  }
  return;
}

Assistant:

inline bool is_prototype() const {
    return type_info_->prototype == this ||
           // If type_info_->prototype is NULL, then we must be constructing
           // the prototype now, which means we must be the prototype.
           type_info_->prototype == NULL;
  }